

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# percent_encode.c
# Opt level: O0

void percent_encode_bs(BinarySink *bs,ptrlen data,char *badchars)

{
  byte val;
  char *pcVar1;
  char *pcVar2;
  char c;
  char *e;
  char *p;
  char *badchars_local;
  BinarySink *bs_local;
  ptrlen data_local;
  
  e = (char *)data.ptr;
  pcVar1 = (char *)ptrlen_end(data);
  do {
    if (pcVar1 <= e) {
      return;
    }
    val = *e;
    if ((val == 0x25) || ((char)val < ' ')) {
LAB_00166620:
      BinarySink_put_fmt(bs->binarysink_,"%%%02X",(ulong)val);
    }
    else {
      if (badchars != (char *)0x0) {
        pcVar2 = strchr(badchars,(int)(char)val);
        if (pcVar2 != (char *)0x0) goto LAB_00166620;
      }
      BinarySink_put_byte(bs->binarysink_,val);
    }
    e = e + 1;
  } while( true );
}

Assistant:

void percent_encode_bs(BinarySink *bs, ptrlen data, const char *badchars)
{
    for (const char *p = data.ptr, *e = ptrlen_end(data); p < e; p++) {
        char c = *p;
        if (c == '%' || c < ' ' || (badchars && strchr(badchars, c)))
            put_fmt(bs, "%%%02X", (unsigned char)c);
        else
            put_byte(bs, c);
    }
}